

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::operator()
          (make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>
           *this,stringstream *msg,char *arg,path *args,char *args_1,char *args_2)

{
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_const_char_*> local_51;
  path local_50;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  Catch::clara::std::filesystem::__cxx11::path::path(&local_50,(path *)args);
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::operator()
            (&local_51,msg,(path *)&local_50,args_1,args_2);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_50);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }